

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

SchemaResolution
avro::anon_unknown_31::checkUnionMatch(NodePtr *writer,NodePtr *reader,size_t *index)

{
  int iVar1;
  int iVar2;
  SchemaResolution SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SchemaResolution SVar4;
  size_t i;
  ulong uVar5;
  
  *index = 0;
  iVar1 = (*reader->px->_vptr_Node[4])();
  uVar5 = 0;
  SVar4 = RESOLVE_NO_MATCH;
  while( true ) {
    if (CONCAT44(extraout_var,iVar1) == uVar5) {
      return SVar4;
    }
    iVar2 = (*reader->px->_vptr_Node[5])(reader->px,uVar5 & 0xffffffff);
    SVar3 = (*writer->px->_vptr_Node[0xc])
                      (writer->px,*(undefined8 *)CONCAT44(extraout_var_00,iVar2));
    if (SVar3 == RESOLVE_MATCH) break;
    if (SVar4 == RESOLVE_NO_MATCH) {
      *index = uVar5;
      SVar4 = SVar3;
    }
    uVar5 = uVar5 + 1;
  }
  *index = uVar5;
  return RESOLVE_MATCH;
}

Assistant:

SchemaResolution    
checkUnionMatch(const NodePtr &writer, const NodePtr &reader, size_t &index)
{
    SchemaResolution bestMatch = RESOLVE_NO_MATCH;
 
    index = 0;
    size_t leaves = reader->leaves();

    for(size_t i=0; i < leaves; ++i) {

        const NodePtr &leaf = reader->leafAt(i);
        SchemaResolution newMatch = writer->resolve(*leaf);

        if(newMatch == RESOLVE_MATCH) {
            bestMatch = newMatch;
            index = i;
            break;
        }
        if(bestMatch == RESOLVE_NO_MATCH) {
            bestMatch = newMatch;
            index = i;
        }
    }

    return bestMatch;
}